

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O0

void __thiscall soul::CPULoadMeasurer::stopMeasurement(CPULoadMeasurer *this)

{
  bool bVar1;
  type d;
  double dVar2;
  double filterAmount;
  double proportion;
  double totalPeriod;
  rep local_30;
  double local_28;
  double thisLength;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point now;
  CPULoadMeasurer *this_local;
  
  now.__d.__r = (duration)(duration)this;
  local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&thisLength);
  bVar1 = std::chrono::operator!=
                    (&this->previousEnd,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&thisLength);
  if (bVar1) {
    totalPeriod = (double)std::chrono::_V2::system_clock::now();
    local_30 = (rep)std::chrono::operator-
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&totalPeriod,&this->currentStart);
    local_28 = toSeconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)local_30);
    d = std::chrono::operator-(&local_18,&this->previousEnd);
    dVar2 = toSeconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_>)d.__r);
    this->runningProportion =
         (local_28 / dVar2 - this->runningProportion) * 0.2 + this->runningProportion;
    std::atomic<float>::operator=(&this->currentLoad,(float)this->runningProportion);
  }
  (this->previousEnd).__d.__r = (rep)local_18.__d.__r;
  return;
}

Assistant:

void CPULoadMeasurer::stopMeasurement()
{
   #if ! JUCE_BELA
    auto now = clock::now();

    if (previousEnd != clock::time_point())
    {
        auto thisLength   = toSeconds (clock::now() - currentStart);
        auto totalPeriod  = toSeconds (now - previousEnd);

        auto proportion = thisLength / totalPeriod;

        const double filterAmount = 0.2;
        runningProportion += filterAmount * (proportion - runningProportion);
        currentLoad = (float) runningProportion;
    }

    previousEnd = now;
   #endif
}